

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O2

Vector * Sub_VV(Vector *V1,Vector *V2)

{
  double dVar1;
  double dVar2;
  size_t Dim;
  Real *pRVar3;
  Real *pRVar4;
  Real *pRVar5;
  LASErrIdType LVar6;
  Vector *V;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  char *Object2Name;
  ulong uVar11;
  
  V_Lock(V1);
  V_Lock(V2);
  LVar6 = LASResult();
  if (LVar6 == LASOK) {
    Dim = V1->Dim;
    if (Dim == V2->Dim) {
      V = (Vector *)malloc(0x30);
      pcVar7 = V_GetName(V1);
      sVar8 = strlen(pcVar7);
      pcVar7 = V_GetName(V2);
      sVar9 = strlen(pcVar7);
      pcVar7 = (char *)malloc(sVar9 + sVar8 + 10);
      pcVar10 = V_GetName(V1);
      Object2Name = V_GetName(V2);
      if ((V == (Vector *)0x0) || (pcVar7 == (char *)0x0)) {
        LASError(LASMemAllocErr,"Sub_VV",pcVar10,Object2Name,(char *)0x0);
        free(V);
      }
      else {
        sprintf(pcVar7,"%s - %s",pcVar10,Object2Name);
        V_Constr(V,pcVar7,Dim,Tempor,True);
        LVar6 = LASResult();
        if (LVar6 == LASOK) {
          pRVar3 = V1->Cmp;
          dVar1 = V1->Multipl;
          dVar2 = V2->Multipl;
          pRVar4 = V2->Cmp;
          pRVar5 = V->Cmp;
          if (2.220446049250313e-15 <= ABS(dVar1 + -1.0)) {
            if (2.220446049250313e-15 <= ABS(dVar2 + -1.0)) {
              for (uVar11 = 1; uVar11 <= Dim; uVar11 = uVar11 + 1) {
                pRVar5[uVar11] = pRVar3[uVar11] * dVar1 + pRVar4[uVar11] * -dVar2;
              }
            }
            else {
              for (uVar11 = 1; uVar11 <= Dim; uVar11 = uVar11 + 1) {
                pRVar5[uVar11] = pRVar3[uVar11] * dVar1 - pRVar4[uVar11];
              }
            }
          }
          else if (2.220446049250313e-15 <= ABS(dVar2 + -1.0)) {
            for (uVar11 = 1; uVar11 <= Dim; uVar11 = uVar11 + 1) {
              pRVar5[uVar11] = pRVar4[uVar11] * -dVar2 + pRVar3[uVar11];
            }
          }
          else {
            for (uVar11 = 1; uVar11 <= Dim; uVar11 = uVar11 + 1) {
              pRVar5[uVar11] = pRVar3[uVar11] - pRVar4[uVar11];
            }
          }
        }
      }
      free(pcVar7);
    }
    else {
      pcVar7 = V_GetName(V1);
      pcVar10 = V_GetName(V2);
      V = (Vector *)0x0;
      LASError(LASDimErr,"Sub_VV",pcVar7,pcVar10,(char *)0x0);
    }
  }
  else {
    V = (Vector *)0x0;
  }
  V_Unlock(V1);
  V_Unlock(V2);
  return V;
}

Assistant:

Vector *Sub_VV(Vector *V1, Vector *V2)
/* VRes = V1 - V2 */
{
    Vector *VRes;

    char *VResName;
    double Multipl1, Multipl2;
    size_t Dim, Ind;
    Real *V1Cmp, *V2Cmp, *VResCmp;

    V_Lock(V1);
    V_Lock(V2);
    
    if (LASResult() == LASOK) {
        if (V1->Dim == V2->Dim) {
            Dim = V1->Dim;
            VRes = (Vector *)malloc(sizeof(Vector));
            VResName = (char *)malloc((strlen(V_GetName(V1)) + strlen(V_GetName(V2)) + 10)
                           * sizeof(char));
            if (VRes != NULL && VResName != NULL) {
                sprintf(VResName, "%s - %s", V_GetName(V1), V_GetName(V2));
                V_Constr(VRes, VResName, Dim, Tempor, True);
                if (LASResult() == LASOK) {
                    V1Cmp = V1->Cmp;
                    V2Cmp = V2->Cmp;
                    VResCmp = VRes->Cmp;
                    if (IsOne(V1->Multipl)) {
                        if (IsOne(V2->Multipl)) {
                           for_AllCmp
                                VResCmp[Ind] = V1Cmp[Ind] - V2Cmp[Ind];
                        } else {
                            Multipl2 = V2->Multipl;
                            for_AllCmp
                                VResCmp[Ind] = V1Cmp[Ind] - Multipl2 * V2Cmp[Ind];
                        }
                    } else {
                        Multipl1 = V1->Multipl;
                        if (IsOne(V2->Multipl)) {
                           for_AllCmp
                                VResCmp[Ind] = Multipl1 * V1Cmp[Ind] - V2Cmp[Ind];
                        } else {
                            Multipl2 = V2->Multipl;
                            for_AllCmp
                                VResCmp[Ind] = Multipl1 * V1Cmp[Ind] - Multipl2 * V2Cmp[Ind];
                        }
                    }
                }
            } else {
                LASError(LASMemAllocErr, "Sub_VV", V_GetName(V1), V_GetName(V2), NULL);
                if (VRes != NULL)
                    free(VRes);
            }
            
            if (VResName != NULL)
                free(VResName);
        } else {
            LASError(LASDimErr, "Sub_VV", V_GetName(V1), V_GetName(V2), NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    V_Unlock(V1);
    V_Unlock(V2);

    return(VRes);
}